

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::
SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
::release(SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
          *this)

{
  deInt32 dVar1;
  SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
  *this_local;
  
  if (this->m_state != (SharedPtrStateBase *)0x0) {
    dVar1 = deAtomicDecrementInt32(&this->m_state->strongRefCount);
    if (dVar1 == 0) {
      this->m_ptr = (InitialCalibration *)0x0;
      (*this->m_state->_vptr_SharedPtrStateBase[2])();
    }
    dVar1 = deAtomicDecrementInt32(&this->m_state->weakRefCount);
    if (dVar1 == 0) {
      if (this->m_state != (SharedPtrStateBase *)0x0) {
        (*this->m_state->_vptr_SharedPtrStateBase[1])();
      }
      this->m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

inline void SharedPtr<T>::release (void)
{
	if (m_state)
	{
		if (deAtomicDecrement32(&m_state->strongRefCount) == 0)
		{
			m_ptr = DE_NULL;
			m_state->deletePtr();
		}

		if (deAtomicDecrement32(&m_state->weakRefCount) == 0)
		{
			delete m_state;
			m_state = DE_NULL;
		}
	}
}